

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void __thiscall
Parser::MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
          (Parser *this,ParseNodePtr elementNode,anon_class_16_2_85211fcd handler)

{
  char cVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  ParseNodeBin *pPVar5;
  ParseNodeVar *pPVar6;
  undefined4 *puVar7;
  anon_class_16_2_85211fcd handler_00;
  
  handler_00.funcInfo = handler.this;
  cVar1 = *(char *)&(this->m_nodeAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.outOfMemoryFunc;
  if (cVar1 == '\x11') {
    pPVar5 = (ParseNodeBin *)ParseNode::AsParseNodeUni((ParseNode *)this);
  }
  else {
    if (cVar1 != '1') goto LAB_008264ae;
    pPVar5 = ParseNode::AsParseNodeBin((ParseNode *)this);
  }
  this = (Parser *)pPVar5->pnode1;
LAB_008264ae:
  bVar2 = *(byte *)&(this->m_nodeAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.outOfMemoryFunc;
  if ((bVar2 & 0xfd) == 0x70) {
    handler_00.this = (ByteCodeGenerator *)elementNode;
    MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
              ((ParseNodePtr)this,handler_00);
    return;
  }
  if ((byte)(bVar2 + 0xaf) < 3) {
    pPVar6 = ParseNode::AsParseNodeVar((ParseNode *)this);
    Symbol::EnsureScopeSlot
              (pPVar6->sym,(ByteCodeGenerator *)elementNode,
               (FuncInfo *)(handler_00.funcInfo)->scriptContext);
    return;
  }
  if (bVar2 != 0xb) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }